

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O3

void rifft2d(float *data,long M2,long M)

{
  xdouble *pxVar1;
  ulong uVar2;
  xdouble *indata;
  long oRsiz;
  long lVar3;
  ulong iRsiz;
  
  if (M < 1 || M2 < 1) {
    M = M + M2;
    oRsiz = 1;
  }
  else {
    if (M == 2) {
      oRsiz = 1L << (M2 & 0x3fU);
      dxpose((xdouble *)data,2,(xdouble *)Array2d[M2],oRsiz,oRsiz,1);
      riffts(Array2d[M2],M2,2);
      lVar3 = 2L << (M2 & 0x3fU);
      xpose(Array2d[M2],oRsiz,Array2d[M2] + lVar3,2,2,oRsiz);
      dxpose((xdouble *)(Array2d[M2] + lVar3),oRsiz,(xdouble *)data,2,1,oRsiz);
      pxVar1 = (xdouble *)(data + 2);
      dxpose(pxVar1,2,(xdouble *)Array2d[M2],oRsiz,oRsiz,1);
      iffts(Array2d[M2],M2,1);
      indata = (xdouble *)Array2d[M2];
      lVar3 = 2;
    }
    else {
      if (M != 1) {
        oRsiz = 1L << (M2 & 0x3fU);
        iRsiz = (ulong)(1L << (M & 0x3fU)) >> 1;
        dxpose((xdouble *)data,iRsiz,(xdouble *)Array2d[M2],oRsiz,oRsiz,1);
        riffts(Array2d[M2],M2,2);
        lVar3 = 2L << (M2 & 0x3fU);
        xpose(Array2d[M2],oRsiz,Array2d[M2] + lVar3,2,2,oRsiz);
        dxpose((xdouble *)(Array2d[M2] + lVar3),oRsiz,(xdouble *)data,iRsiz,1,oRsiz);
        dxpose((xdouble *)(data + 2),iRsiz,(xdouble *)Array2d[M2],oRsiz,oRsiz,3);
        iffts(Array2d[M2],M2,3);
        dxpose((xdouble *)Array2d[M2],oRsiz,(xdouble *)(data + 2),iRsiz,3,oRsiz);
        if (3 < (ulong)M) {
          uVar2 = 4;
          pxVar1 = (xdouble *)data;
          do {
            pxVar1 = pxVar1 + 4;
            dxpose(pxVar1,iRsiz,(xdouble *)Array2d[M2],oRsiz,oRsiz,4);
            iffts(Array2d[M2],M2,4);
            dxpose((xdouble *)Array2d[M2],oRsiz,pxVar1,iRsiz,4,oRsiz);
            uVar2 = uVar2 + 4;
          } while (uVar2 < iRsiz);
        }
        goto LAB_0010244a;
      }
      oRsiz = 1L << (M2 & 0x3fU);
      dxpose((xdouble *)data,1,(xdouble *)Array2d[M2],oRsiz,oRsiz,1);
      riffts(Array2d[M2],M2,2);
      lVar3 = 2L << (M2 & 0x3fU);
      xpose(Array2d[M2],oRsiz,Array2d[M2] + lVar3,2,2,oRsiz);
      indata = (xdouble *)(Array2d[M2] + lVar3);
      lVar3 = 1;
      pxVar1 = (xdouble *)data;
    }
    dxpose(indata,oRsiz,pxVar1,lVar3,1,oRsiz);
  }
LAB_0010244a:
  riffts(data,M,oRsiz);
  return;
}

Assistant:

void rifft2d(float *data, long M2, long M){
/* Compute 2D real ifft and return results in-place	*/
/* The input must be in the order as outout from rfft2d */
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows out */
/* M = log2 of fft size number of columns out */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	if (M==1){
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2));
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));
	}
	else if (M==2){
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2)); 
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		iffts(Array2d[M2], M2, 1);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 1, POW2(M2));
	}
	else{
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2));
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 3);
		iffts(Array2d[M2], M2, 3);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 3, POW2(M2));
		for (i1=4; i1<POW2(M)/2; i1+=4){
			cxpose(data + i1*2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 4);
			iffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M)/2, 4, POW2(M2));
		}
	}
	riffts(data, M, POW2(M2));
}
else
	riffts(data, M2+M, 1);
}